

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O3

void array_delete<Lib::Map<unsigned_int,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::Bucket,Lib::DefaultHash>::Entry>
               (Entry *array,size_t length)

{
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *this;
  
  if (length != 0) {
    this = (Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *)((long)&array[length - 1]._value + 0x20);
    do {
      if (*(int *)&this[-3].field_0x8 != 0) {
        Lib::
        Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled(this);
        mpz_clear((__mpz_struct *)(this + -1));
        mpz_clear((__mpz_struct *)(this + -2));
      }
      length = length - 1;
      this = (Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)&this[-4].field_0x8;
    } while (length != 0);
  }
  return;
}

Assistant:

void array_delete(T* array, size_t length)
{
  ASS_NEQ(array,0);
  ASS_G(length,0);

  array+=length;
  while(length--) {
    (--array)->~T();
  }
}